

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O3

int demmt_drm_ioctl_pre(uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
                       void *state,mmt_memory_dump *args,int argc)

{
  drm_nouveau_gem_new *g;
  uint uVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  
  g = (drm_nouveau_gem_new *)(buf + 1);
  if ((int)id < -0x3fbf9b7f) {
    if ((int)id < -0x3fef9bbb) {
      if ((int)id < -0x3fef9bf5) {
        if (id == 0x80046402) {
          return 0;
        }
        if (id == 0xc0106407) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar4 = colors->reset;
          pcVar8 = colors->rname;
          pcVar9 = (char *)(ulong)buf[1].len;
          pcVar6 = (char *)(ulong)buf[2].len;
          pcVar7 = (char *)(ulong)buf[3].len;
          uVar10 = (ulong)buf[4].len;
          if (indent_logs == 0) {
            pcVar2 = 
            "LOG: %sDRM_IOCTL_SET_VERSION%s pre,  di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
            ;
LAB_002486d7:
            fprintf(_stdout,pcVar2,pcVar8,pcVar4,pcVar9,pcVar6,pcVar7);
          }
          else {
            pcVar5 = 
            "%64s%sDRM_IOCTL_SET_VERSION%s pre,  di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
            ;
            pcVar2 = " ";
LAB_002485e7:
            fprintf(_stdout,pcVar5,pcVar2,pcVar8,pcVar4,pcVar9,pcVar6,pcVar7,uVar10);
          }
          goto LAB_00248758;
        }
      }
      else {
        if (id == 0xc010640b) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar8 = colors->reset;
          pcVar2 = colors->rname;
          pcVar4 = colors->eval;
          pcVar9 = (char *)(ulong)(g->info).handle;
          if (indent_logs != 0) {
            pcVar6 = "%64s%sDRM_IOCTL_GEM_OPEN%s pre,  name: %s%d%s\n";
            goto LAB_0024874d;
          }
          pcVar7 = "LOG: %sDRM_IOCTL_GEM_OPEN%s pre,  name: %s%d%s\n";
          pcVar6 = pcVar8;
          goto LAB_0024867f;
        }
        if (id == 0xc010640c) {
          return 0;
        }
        if (id == 0xc0106440) {
          return 0;
        }
      }
    }
    else if ((int)id < -0x3fd79b7c) {
      if (id == 0xc0106445) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar4 = colors->reset;
        pcVar8 = colors->rname;
        pcVar9 = (char *)(ulong)buf[1].len;
        pcVar6 = (char *)(ulong)buf[2].len;
        pcVar7 = (char *)(ulong)buf[3].len;
        if (indent_logs == 0) {
          pcVar2 = 
          "LOG: %sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s pre,  channel: %d, handle: 0x%0x, size: %d\n";
          goto LAB_002486d7;
        }
        pcVar7 = 
        "%64s%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s pre,  channel: %d, handle: 0x%0x, size: %d\n";
        pcVar2 = " ";
        goto LAB_0024867f;
      }
      if (id == 0xc0246400) {
        return 0;
      }
    }
    else {
      if (id == 0xc0286484) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar8 = colors->reset;
        pcVar2 = colors->rname;
        pcVar4 = colors->num;
        pcVar9 = (char *)(ulong)(g->info).handle;
        if (indent_logs != 0) {
          pcVar6 = "%64s%sDRM_NOUVEAU_GEM_INFO%s pre,  handle: %s%3d%s\n";
          goto LAB_0024874d;
        }
        pcVar7 = "LOG: %sDRM_NOUVEAU_GEM_INFO%s pre,  handle: %s%3d%s\n";
        pcVar6 = pcVar8;
LAB_0024867f:
        fprintf(_stdout,pcVar7,pcVar2,pcVar8,pcVar4,pcVar9,pcVar6);
        goto LAB_00248758;
      }
      if (id == 0xc0306480) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        if (indent_logs == 0) {
          fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_NEW%s pre,  ",colors->rname,colors->reset);
        }
        else {
          fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_NEW%s pre,  "," ");
        }
        dump_drm_nouveau_gem_new(g);
        fputc(10,_stdout);
        goto LAB_00248758;
      }
      if (id == 0xc0406400) {
        return 0;
      }
    }
LAB_002484c1:
    if ((id & 0xfffffffe) == 0x641e) {
      return 0;
    }
    if (id == 0xc008640a) {
      return 0;
    }
    if (id == 0x40046411) {
      return 0;
    }
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG: %sunknown drm ioctl%s %x\n",colors->err,colors->reset,(ulong)nr);
    }
    else {
      fprintf(_stdout,"%64s%sunknown drm ioctl%s %x\n"," ",colors->err);
    }
    iVar3 = 1;
  }
  else {
    if ((int)id < 0x40086409) {
      if ((int)id < -0x3fa79bbe) {
        if (id == 0xc0406481) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar4 = colors->reset;
          pcVar2 = colors->num;
          if (indent_logs == 0) {
            fprintf(_stdout,
                    "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s pre,  channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu\n"
                    ,colors->rname,pcVar4,(ulong)buf[1].len,pcVar2,(ulong)buf[2].len,pcVar4,
                    *(undefined8 *)(buf + 3),pcVar2,(ulong)buf[5].len,pcVar4,
                    *(undefined8 *)(buf + 7),pcVar2,(ulong)buf[6].len,pcVar4,
                    *(undefined8 *)(buf + 9),(ulong)buf[0xb].len,(ulong)buf[0xc].len,
                    *(undefined8 *)(buf + 0xd),*(undefined8 *)(buf + 0xf));
          }
          else {
            fprintf(_stdout,
                    "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s pre,  channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu\n"
                    ," ",colors->rname,pcVar4,(ulong)buf[1].len,pcVar2,(ulong)buf[2].len,pcVar4,
                    *(undefined8 *)(buf + 3),pcVar2,(ulong)buf[5].len,pcVar4,
                    *(undefined8 *)(buf + 7),pcVar2,(ulong)buf[6].len,pcVar4,
                    *(undefined8 *)(buf + 9),(ulong)buf[0xb].len,(ulong)buf[0xc].len,
                    *(undefined8 *)(buf + 0xd),*(undefined8 *)(buf + 0xf));
          }
        }
        else {
          if (id != 0xc04064a0) goto LAB_002484c1;
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          if (indent_logs == 0) {
            fprintf(_stdout,
                    "LOG: %sDRM_IOCTL_MODE_GETRESOURCES%s pre,  fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                    ,colors->rname,colors->reset,*(undefined8 *)(buf + 1),*(undefined8 *)(buf + 3),
                    *(undefined8 *)(buf + 5),*(undefined8 *)(buf + 7),(ulong)buf[9].len,
                    (ulong)buf[10].len,(ulong)buf[0xb].len,(ulong)buf[0xc].len,(ulong)buf[0xd].len,
                    (ulong)buf[0xe].len,(ulong)buf[0xf].len,(ulong)buf[0x10].len);
          }
          else {
            fprintf(_stdout,
                    "%64s%sDRM_IOCTL_MODE_GETRESOURCES%s pre,  fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                    ," ");
          }
        }
      }
      else if (id == 0xc0586442) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar4 = colors->reset;
        pcVar8 = colors->rname;
        pcVar9 = (char *)(ulong)buf[1].len;
        pcVar6 = (char *)(ulong)buf[2].len;
        if (indent_logs != 0) {
          pcVar7 = "%64s%sDRM_NOUVEAU_CHANNEL_ALLOC%s pre,  fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x\n";
LAB_00248273:
          pcVar2 = " ";
          goto LAB_0024867f;
        }
        pcVar2 = "LOG: %sDRM_NOUVEAU_CHANNEL_ALLOC%s pre,  fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x\n";
LAB_0024871d:
        fprintf(_stdout,pcVar2,pcVar8,pcVar4,pcVar9,pcVar6);
      }
      else {
        if (id == 0x40046443) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar4 = colors->reset;
          pcVar2 = colors->rname;
          uVar1 = (g->info).handle;
          if (indent_logs == 0) {
            pcVar8 = "LOG: %sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d\n";
LAB_00248690:
            fprintf(_stdout,pcVar8,pcVar2,pcVar4,(ulong)uVar1);
            goto LAB_00248758;
          }
          pcVar4 = "%64s%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d\n";
        }
        else {
          if (id != 0x40046483) goto LAB_002484c1;
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar4 = colors->reset;
          pcVar2 = colors->rname;
          uVar1 = (g->info).handle;
          if (indent_logs == 0) {
            pcVar8 = "LOG: %sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d\n";
            goto LAB_00248690;
          }
          pcVar4 = "%64s%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d\n";
        }
        fprintf(_stdout,pcVar4," ");
      }
    }
    else if ((int)id < 0x40086482) {
      if (id != 0x40086409) {
        if (id != 0x40086446) goto LAB_002484c1;
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar4 = colors->reset;
        pcVar8 = colors->rname;
        pcVar9 = (char *)(ulong)buf[1].len;
        pcVar6 = (char *)(ulong)buf[2].len;
        if (indent_logs != 0) {
          pcVar7 = "%64s%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x\n";
          goto LAB_00248273;
        }
        pcVar2 = "LOG: %sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x\n";
        goto LAB_0024871d;
      }
      if (dump_decoded_ioctl_data == 0) {
        return 0;
      }
      pcVar8 = colors->reset;
      pcVar2 = colors->rname;
      pcVar4 = colors->num;
      pcVar9 = (char *)(ulong)(g->info).handle;
      if (indent_logs == 0) {
        pcVar7 = "LOG: %sDRM_IOCTL_GEM_CLOSE%s, handle: %s%3d%s\n";
        pcVar6 = pcVar8;
        goto LAB_0024867f;
      }
      pcVar6 = "%64s%sDRM_IOCTL_GEM_CLOSE%s, handle: %s%3d%s\n";
LAB_0024874d:
      pcVar5 = pcVar4;
      pcVar7 = pcVar2;
      pcVar2 = " ";
LAB_0024874f:
      fprintf(_stdout,pcVar6,pcVar2,pcVar7,pcVar8,pcVar5,pcVar9);
    }
    else if (id == 0x40086482) {
      if (dump_decoded_ioctl_data == 0) {
        return 0;
      }
      pcVar8 = colors->reset;
      pcVar2 = colors->rname;
      pcVar4 = colors->num;
      uVar10 = (ulong)buf[2].len;
      pcVar7 = colors->eval;
      if (indent_logs == 0) {
        pcVar5 = "LOG: %sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %s%3d%s, flags: %s0x%0x%s\n";
        pcVar9 = (char *)(ulong)buf[1].len;
        pcVar6 = pcVar8;
        goto LAB_002485e7;
      }
      fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %s%3d%s, flags: %s0x%0x%s\n"," ",
              pcVar2,pcVar8,pcVar4,(ulong)buf[1].len,pcVar8,pcVar7,uVar10,pcVar8);
    }
    else {
      if (id != 0x400c6444) {
        if (id != 0x40106441) goto LAB_002484c1;
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar7 = colors->reset;
        pcVar2 = colors->rname;
        pcVar5 = *(char **)&g->info;
        if (indent_logs != 0) {
          if (pcVar5 < (char *)0xe) {
            pcVar4 = nouveau_param_names[(long)pcVar5];
          }
          else {
            pcVar4 = "???";
          }
          pcVar6 = "%64s%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx\n";
          pcVar8 = pcVar7;
          pcVar9 = pcVar5;
          goto LAB_0024874d;
        }
        if (pcVar5 < (char *)0xe) {
          pcVar8 = nouveau_param_names[(long)pcVar5];
        }
        else {
          pcVar8 = "???";
        }
        pcVar6 = "LOG: %sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx\n";
        pcVar9 = *(char **)(buf + 3);
        goto LAB_0024874f;
      }
      if (dump_decoded_ioctl_data == 0) {
        return 0;
      }
      pcVar4 = colors->reset;
      if (indent_logs == 0) {
        fprintf(_stdout,
                "LOG: %sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s\n"
                ,colors->rname,pcVar4,(ulong)buf[1].len,colors->num,(ulong)buf[2].len,pcVar4,
                colors->eval,(ulong)buf[3].len,pcVar4);
      }
      else {
        fprintf(_stdout,
                "%64s%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s\n",
                " ",colors->rname,pcVar4,(ulong)buf[1].len,colors->num,(ulong)buf[2].len,pcVar4,
                colors->eval,(ulong)buf[3].len,pcVar4);
      }
    }
LAB_00248758:
    iVar3 = 0;
  }
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return iVar3;
}

Assistant:

int demmt_drm_ioctl_pre(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr, uint16_t size,
		struct mmt_buf *buf, void *state, struct mmt_memory_dump *args, int argc)
{
	void *ioctl_data = buf->data;

	if (id == DRM_NOUVEAU_IOCTL_GETPARAM)
	{
		struct drm_nouveau_getparam *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%" PRIx64 ")\n",
					colors->rname, colors->reset, colors->eval,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] : "???",
					colors->reset, data->param);
	}
	else if (id == DRM_NOUVEAU_IOCTL_SETPARAM)
	{
		struct drm_nouveau_setparam *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%" PRIx64 "), value: 0x%" PRIx64 "\n",
					colors->rname, colors->reset,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] : "???",
					data->param, data->value);
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_ALLOC)
	{
		struct drm_nouveau_channel_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_CHANNEL_ALLOC%s pre,  fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x\n",
					colors->rname, colors->reset, data->fb_ctxdma_handle, data->tt_ctxdma_handle);
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_FREE)
	{
		struct drm_nouveau_channel_free *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d\n", colors->rname,
					colors->reset, data->channel);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GROBJ_ALLOC)
	{
		struct drm_nouveau_grobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->handle, colors->reset, colors->eval, data->class, colors->reset);
	}
	else if (id == DRM_NOUVEAU_IOCTL_NOTIFIEROBJ_ALLOC)
	{
		struct drm_nouveau_notifierobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s pre,  channel: %d, handle: 0x%0x, size: %d\n",
					colors->rname, colors->reset, data->channel, data->handle, data->size);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GPUOBJ_FREE)
	{
		struct drm_nouveau_gpuobj_free *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x\n",
					colors->rname, colors->reset, data->channel, data->handle);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_NEW)
	{
		struct drm_nouveau_gem_new *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_NEW%s pre,  ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_new(data);
			mmt_log_cont_nl();
		}
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_PUSHBUF)
	{
		struct drm_nouveau_gem_pushbuf *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s pre,  channel: %d, nr_buffers: %s%d%s, buffers: 0x%" PRIx64 ", nr_relocs: %s%d%s, relocs: 0x%" PRIx64 ", nr_push: %s%d%s, push: 0x%" PRIx64 ", suffix0: 0x%x, suffix1: 0x%x, vram_available: %" PRIu64 ", gart_available: %" PRIu64 "\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->nr_buffers, colors->reset, data->buffers, colors->num,
					data->nr_relocs, colors->reset,data->relocs, colors->num,
					data->nr_push, colors->reset, data->push, data->suffix0,
					data->suffix1, data->vram_available, data->gart_available);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_PREP)
	{
		struct drm_nouveau_gem_cpu_prep *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %s%3d%s, flags: %s0x%0x%s\n",
					colors->rname, colors->reset, colors->num, data->handle,
					colors->reset, colors->eval, data->flags, colors->reset);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_FINI)
	{
		struct drm_nouveau_gem_cpu_fini *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d\n", colors->rname,
					colors->reset, data->handle);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_INFO)
	{
		struct drm_nouveau_gem_info *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_INFO%s pre,  handle: %s%3d%s\n", colors->rname,
					colors->reset, colors->num, data->handle, colors->reset);
	}
	else if (id == DRM_IOCTL_VERSION64)
	{
		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_VERSION64%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_VERSION32)
	{
		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_VERSION32%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_GET_MAGIC)
	{
		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_GET_MAGIC%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_GEM_CLOSE)
	{
		struct drm_gem_close *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_CLOSE%s, handle: %s%3d%s\n", colors->rname,
					colors->reset, colors->num, data->handle, colors->reset);
	}
	else if (id == DRM_IOCTL_GEM_OPEN)
	{
		struct drm_gem_open *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_OPEN%s pre,  name: %s%d%s\n", colors->rname,
					colors->reset, colors->eval, data->name, colors->reset);
	}
	else if (id == DRM_IOCTL_GET_CAP)
	{
		struct drm_get_cap *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_GET_CAP%s, capability: %llu\n", colors->rname,
					colors->reset, data->capability);
	}
	else if (id == DRM_IOCTL_SET_VERSION)
	{
		struct drm_set_version *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_VERSION%s pre,  di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n",
					colors->rname, colors->reset, data->drm_di_major,
					data->drm_di_minor, data->drm_dd_major, data->drm_dd_minor);
	}
	else if (id == DRM_IOCTL_MODE_GETRESOURCES)
	{
		struct drm_mode_card_res *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_MODE_GETRESOURCES%s pre,  fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, "
					"encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, "
					"min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n", colors->rname,
					colors->reset,
					(void *)(uintptr_t)data->fb_id_ptr,
					(void *)(uintptr_t)data->crtc_id_ptr,
					(void *)(uintptr_t)data->connector_id_ptr,
					(void *)(uintptr_t)data->encoder_id_ptr,
					data->count_fbs, data->count_crtcs, data->count_connectors,
					data->count_encoders, data->min_width, data->max_width,
					data->min_height, data->max_height);
	}
	else if (id == DRM_IOCTL_SET_MASTER)
	{
		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_MASTER%s pre\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_DROP_MASTER)
	{
		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_DROP_MASTER%s pre\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_AUTH_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_AUTH_MAGIC%s pre,  magic: 0x%x\n", colors->rname, colors->reset, data->magic);
	}
	else if (id == DRM_IOCTL_GEM_FLINK)
	{
		struct drm_gem_flink *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_FLINK%s pre,  handle: 0x%x, name: 0x%x\n",
					colors->rname, colors->reset, data->handle, data->name);
	}
	else
	{
		mmt_log("%sunknown drm ioctl%s %x\n", colors->err, colors->reset, nr);
		return 1;
	}

	return 0;
}